

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O3

void __thiscall
embree::avx::BVHNSubdivPatch1MBlurBuilderSAH<4>::build(BVHNSubdivPatch1MBlurBuilderSAH<4> *this)

{
  size_t *psVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  BVHN<4> *pBVar4;
  BBox<embree::Vec3fa> *pBVar5;
  char *ptr;
  PrimRefMB *pPVar6;
  MemoryMonitorInterface *pMVar7;
  ulong uVar8;
  undefined8 uVar9;
  EVP_PKEY_CTX *pEVar10;
  long *plVar11;
  PrimRefMB *pPVar12;
  BBox<embree::Vec3fa> *pBVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  EVP_PKEY_CTX *pEVar19;
  EVP_PKEY_CTX *pEVar20;
  ulong uVar21;
  ulong uVar22;
  EVP_PKEY_CTX *pEVar23;
  size_t sVar24;
  size_t sVar25;
  size_t numSubPatchesMB;
  size_t numSubPatches;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> pstate;
  ulong local_4cb8;
  double local_4cb0;
  EVP_PKEY_CTX *local_4ca8 [2];
  EVP_PKEY_CTX local_4c98 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4c88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4c78;
  undefined4 local_4c68;
  undefined4 uStack_4c64;
  undefined4 uStack_4c60;
  undefined4 uStack_4c5c;
  undefined4 local_4c58;
  undefined4 uStack_4c54;
  undefined4 uStack_4c50;
  undefined4 uStack_4c4c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4c48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c38;
  undefined4 local_4c28;
  undefined4 uStack_4c24;
  undefined4 uStack_4c20;
  undefined4 uStack_4c1c;
  undefined4 local_4c18;
  undefined4 uStack_4c14;
  undefined4 uStack_4c10;
  undefined4 uStack_4c0c;
  undefined8 local_4848;
  
  if ((this->scene->world).numMBSubdivPatches == 0) {
    if ((this->primsMB).size_active != 0) {
      (this->primsMB).size_active = 0;
    }
    (this->primsMB).size_active = 0;
    sVar25 = (this->bounds).size_alloced;
    if ((this->bounds).size_active != 0) {
      (this->bounds).size_active = 0;
    }
    if ((this->bounds).size_alloced == sVar25) {
      (this->bounds).size_active = 0;
      goto LAB_01456705;
    }
    pBVar5 = (this->bounds).items;
    if (sVar25 == 0) {
      sVar24 = 0;
LAB_0145665f:
      pBVar13 = (BBox<embree::Vec3fa> *)alignedMalloc(sVar24,0x10);
    }
    else {
      pMVar7 = (this->bounds).alloc.device;
      sVar24 = sVar25 << 5;
      (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar24,0);
      if (sVar24 < 0x1c00000) goto LAB_0145665f;
      pBVar13 = (BBox<embree::Vec3fa> *)os_malloc(sVar24,&(this->bounds).alloc.hugepages);
    }
    (this->bounds).items = pBVar13;
    if ((this->bounds).size_active == 0) {
      sVar24 = (this->bounds).size_alloced;
      if (pBVar5 != (BBox<embree::Vec3fa> *)0x0) goto LAB_014566b6;
    }
    else {
      lVar14 = 0x10;
      uVar16 = 0;
      do {
        pBVar13 = (this->bounds).items;
        puVar2 = (undefined8 *)((long)pBVar5 + lVar14 + -0x10);
        uVar9 = puVar2[1];
        puVar3 = (undefined8 *)((long)pBVar13 + lVar14 + -0x10);
        *puVar3 = *puVar2;
        puVar3[1] = uVar9;
        puVar2 = (undefined8 *)((long)&(pBVar5->lower).field_0 + lVar14);
        uVar9 = puVar2[1];
        puVar3 = (undefined8 *)((long)&(pBVar13->lower).field_0 + lVar14);
        *puVar3 = *puVar2;
        puVar3[1] = uVar9;
        uVar16 = uVar16 + 1;
        lVar14 = lVar14 + 0x20;
      } while (uVar16 < (this->bounds).size_active);
      sVar24 = (this->bounds).size_alloced;
LAB_014566b6:
      if (sVar24 << 5 < 0x1c00000) {
        alignedFree(pBVar5);
      }
      else {
        os_free(pBVar5,sVar24 << 5,(this->bounds).alloc.hugepages);
      }
    }
    if (sVar24 != 0) {
      pMVar7 = (this->bounds).alloc.device;
      (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar24 * -0x20,1);
    }
    (this->bounds).size_active = 0;
    (this->bounds).size_alloced = sVar25;
LAB_01456705:
    local_4c48._0_8_ = 0x7f8000007f800000;
    local_4c48._8_8_ = 0x7f8000007f800000;
    local_4c38._M_allocated_capacity = 0xff800000ff800000;
    local_4c38._8_8_ = 0xff800000ff800000;
    local_4c28 = 0x7f800000;
    uStack_4c24 = 0x7f800000;
    uStack_4c20 = 0x7f800000;
    uStack_4c1c = 0x7f800000;
    local_4c18 = 0xff800000;
    uStack_4c14 = 0xff800000;
    uStack_4c10 = 0xff800000;
    uStack_4c0c = 0xff800000;
    BVHN<4>::set(this->bvh,(NodeRef)0x8,(LBBox3fa *)&local_4c48.field_1,0);
    return;
  }
  pBVar4 = this->bvh;
  local_4ca8[0] = local_4c98;
  std::__cxx11::string::_M_construct((ulong)local_4ca8,'\x01');
  *local_4ca8[0] = (EVP_PKEY_CTX)0x34;
  plVar11 = (long *)std::__cxx11::string::replace((ulong)local_4ca8,0,(char *)0x0,0x1fb0eed);
  paVar17 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)(plVar11 + 2);
  if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)*plVar11 == paVar17) {
    local_4c78._0_8_ = *(undefined8 *)paVar17;
    local_4c78._8_8_ = plVar11[3];
    local_4c88._0_8_ = &local_4c78;
  }
  else {
    local_4c78._0_8_ = *(undefined8 *)paVar17;
    local_4c88._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)*plVar11;
  }
  local_4c88._8_8_ = plVar11[1];
  *plVar11 = (long)paVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_4c88);
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 == paVar18) {
    local_4c38._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_4c38._8_8_ = plVar11[3];
    local_4c48._0_8_ = &local_4c38;
  }
  else {
    local_4c38._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_4c48._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar11;
  }
  local_4c48._8_8_ = plVar11[1];
  *plVar11 = (long)paVar18;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  local_4cb0 = BVHN<4>::preBuild(pBVar4,(string *)&local_4c48.field_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c48._0_8_ != &local_4c38) {
    operator_delete((void *)local_4c48._0_8_);
  }
  if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_4c88._0_8_ != &local_4c78) {
    operator_delete((void *)local_4c88._0_8_);
  }
  if (local_4ca8[0] != local_4c98) {
    operator_delete(local_4ca8[0]);
  }
  local_4848 = 0;
  countSubPatches(this,(size_t *)local_4ca8,&local_4cb8,
                  (ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_>
                   *)&local_4c48.field_1);
  pEVar10 = local_4ca8[0];
  pEVar23 = (EVP_PKEY_CTX *)(this->primsMB).size_alloced;
  pEVar20 = pEVar23;
  if ((pEVar23 < local_4ca8[0]) &&
     (pEVar20 = local_4ca8[0], pEVar19 = pEVar23, pEVar23 != (EVP_PKEY_CTX *)0x0)) {
    do {
      pEVar20 = (EVP_PKEY_CTX *)((long)pEVar19 * 2 + (ulong)((long)pEVar19 * 2 == 0));
      pEVar19 = pEVar20;
    } while (pEVar20 < local_4ca8[0]);
  }
  psVar1 = &(this->primsMB).size_active;
  if (local_4ca8[0] < (EVP_PKEY_CTX *)(this->primsMB).size_active) {
    *psVar1 = (size_t)local_4ca8[0];
  }
  if (pEVar23 == pEVar20) {
    *psVar1 = (size_t)local_4ca8[0];
  }
  else {
    pPVar6 = (this->primsMB).items;
    if (pEVar20 == (EVP_PKEY_CTX *)0x0) {
      uVar16 = 0;
LAB_01456320:
      pPVar12 = (PrimRefMB *)alignedMalloc(uVar16,0x10);
    }
    else {
      pMVar7 = (this->primsMB).alloc.device;
      uVar16 = (long)pEVar20 * 0x50;
      (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,uVar16,0);
      if (uVar16 < 0x1c00000) goto LAB_01456320;
      pPVar12 = (PrimRefMB *)os_malloc(uVar16,&(this->primsMB).alloc.hugepages);
    }
    (this->primsMB).items = pPVar12;
    if ((this->primsMB).size_active == 0) {
      sVar25 = (this->primsMB).size_alloced;
      if (pPVar6 != (PrimRefMB *)0x0) goto LAB_0145639b;
    }
    else {
      lVar14 = 0x40;
      uVar16 = 0;
      do {
        pPVar12 = (this->primsMB).items;
        puVar2 = (undefined8 *)((long)pPVar6 + lVar14 + -0x40);
        uVar9 = puVar2[1];
        puVar3 = (undefined8 *)((long)pPVar12 + lVar14 + -0x40);
        *puVar3 = *puVar2;
        puVar3[1] = uVar9;
        puVar2 = (undefined8 *)((long)pPVar6 + lVar14 + -0x30);
        uVar9 = puVar2[1];
        puVar3 = (undefined8 *)((long)pPVar12 + lVar14 + -0x30);
        *puVar3 = *puVar2;
        puVar3[1] = uVar9;
        puVar2 = (undefined8 *)((long)pPVar6 + lVar14 + -0x20);
        uVar9 = puVar2[1];
        puVar3 = (undefined8 *)((long)pPVar12 + lVar14 + -0x20);
        *puVar3 = *puVar2;
        puVar3[1] = uVar9;
        puVar2 = (undefined8 *)((long)pPVar6 + lVar14 + -0x10);
        uVar9 = puVar2[1];
        puVar3 = (undefined8 *)((long)pPVar12 + lVar14 + -0x10);
        *puVar3 = *puVar2;
        puVar3[1] = uVar9;
        *(undefined8 *)((long)&(pPVar12->lbounds).bounds0.lower.field_0 + lVar14) =
             *(undefined8 *)((long)&(pPVar6->lbounds).bounds0.lower.field_0 + lVar14);
        uVar16 = uVar16 + 1;
        lVar14 = lVar14 + 0x50;
      } while (uVar16 < (this->primsMB).size_active);
      sVar25 = (this->primsMB).size_alloced;
LAB_0145639b:
      if (sVar25 * 0x50 < 0x1c00000) {
        alignedFree(pPVar6);
      }
      else {
        os_free(pPVar6,sVar25 * 0x50,(this->primsMB).alloc.hugepages);
      }
    }
    if (sVar25 != 0) {
      pMVar7 = (this->primsMB).alloc.device;
      (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar25 * -0x50,1);
    }
    (this->primsMB).size_active = (size_t)pEVar10;
    (this->primsMB).size_alloced = (size_t)pEVar20;
  }
  uVar8 = local_4cb8;
  uVar16 = (this->bounds).size_alloced;
  uVar22 = uVar16;
  if ((uVar16 < local_4cb8) && (uVar22 = local_4cb8, uVar21 = uVar16, uVar16 != 0)) {
    do {
      uVar22 = uVar21 * 2 + (ulong)(uVar21 * 2 == 0);
      uVar21 = uVar22;
    } while (uVar22 < local_4cb8);
  }
  if (local_4cb8 < (this->bounds).size_active) {
    (this->bounds).size_active = local_4cb8;
  }
  if (uVar16 == uVar22) {
    (this->bounds).size_active = local_4cb8;
    goto LAB_01456508;
  }
  pBVar5 = (this->bounds).items;
  if (uVar22 == 0) {
    sVar25 = 0;
LAB_01456466:
    pBVar13 = (BBox<embree::Vec3fa> *)alignedMalloc(sVar25,0x10);
  }
  else {
    pMVar7 = (this->bounds).alloc.device;
    sVar25 = uVar22 << 5;
    (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar25,0);
    if (sVar25 < 0x1c00000) goto LAB_01456466;
    pBVar13 = (BBox<embree::Vec3fa> *)os_malloc(sVar25,&(this->bounds).alloc.hugepages);
  }
  (this->bounds).items = pBVar13;
  if ((this->bounds).size_active == 0) {
    sVar25 = (this->bounds).size_alloced;
    if (pBVar5 != (BBox<embree::Vec3fa> *)0x0) goto LAB_014564bd;
  }
  else {
    lVar14 = 0x10;
    uVar16 = 0;
    do {
      pBVar13 = (this->bounds).items;
      puVar2 = (undefined8 *)((long)pBVar5 + lVar14 + -0x10);
      uVar9 = puVar2[1];
      puVar3 = (undefined8 *)((long)pBVar13 + lVar14 + -0x10);
      *puVar3 = *puVar2;
      puVar3[1] = uVar9;
      puVar2 = (undefined8 *)((long)&(pBVar5->lower).field_0 + lVar14);
      uVar9 = puVar2[1];
      puVar3 = (undefined8 *)((long)&(pBVar13->lower).field_0 + lVar14);
      *puVar3 = *puVar2;
      puVar3[1] = uVar9;
      uVar16 = uVar16 + 1;
      lVar14 = lVar14 + 0x20;
    } while (uVar16 < (this->bounds).size_active);
    sVar25 = (this->bounds).size_alloced;
LAB_014564bd:
    if (sVar25 << 5 < 0x1c00000) {
      alignedFree(pBVar5);
    }
    else {
      os_free(pBVar5,sVar25 << 5,(this->bounds).alloc.hugepages);
    }
  }
  if (sVar25 != 0) {
    pMVar7 = (this->bounds).alloc.device;
    (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar25 * -0x20,1);
  }
  (this->bounds).size_active = uVar8;
  (this->bounds).size_alloced = uVar22;
LAB_01456508:
  pBVar4 = this->bvh;
  if (local_4ca8[0] == (EVP_PKEY_CTX *)0x0) {
    local_4c88._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)0x7f8000007f800000;
    local_4c88._8_8_ = 0x7f8000007f800000;
    local_4c78._0_8_ = -0x7fffff00800000;
    local_4c78._8_8_ = -0x7fffff00800000;
    local_4c68 = 0x7f800000;
    uStack_4c64 = 0x7f800000;
    uStack_4c60 = 0x7f800000;
    uStack_4c5c = 0x7f800000;
    local_4c58 = 0xff800000;
    uStack_4c54 = 0xff800000;
    uStack_4c50 = 0xff800000;
    uStack_4c4c = 0xff800000;
    BVHN<4>::set(pBVar4,(NodeRef)0x8,(LBBox3fa *)&local_4c88.field_1,0);
  }
  else {
    uVar8 = local_4cb8 * 0x140;
    uVar16 = (pBVar4->subdiv_patches).size_alloced;
    uVar22 = uVar16;
    if ((uVar16 < uVar8) && (uVar22 = uVar8, uVar21 = uVar16, uVar16 != 0)) {
      do {
        uVar22 = uVar21 * 2 + (ulong)(uVar21 * 2 == 0);
        uVar21 = uVar22;
      } while (uVar22 < uVar8);
    }
    if (uVar8 < (pBVar4->subdiv_patches).size_active) {
      (pBVar4->subdiv_patches).size_active = uVar8;
    }
    if (uVar16 == uVar22) {
      (pBVar4->subdiv_patches).size_active = uVar8;
    }
    else {
      ptr = (pBVar4->subdiv_patches).items;
      pcVar15 = (char *)alignedMalloc(uVar22,0x20);
      (pBVar4->subdiv_patches).items = pcVar15;
      if ((pBVar4->subdiv_patches).size_active != 0) {
        uVar16 = 0;
        do {
          (pBVar4->subdiv_patches).items[uVar16] = ptr[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar16 < (pBVar4->subdiv_patches).size_active);
      }
      alignedFree(ptr);
      (pBVar4->subdiv_patches).size_active = uVar8;
      (pBVar4->subdiv_patches).size_alloced = uVar22;
    }
    pEVar23 = local_4ca8[0];
    rebuild(this,(size_t)local_4ca8[0],
            (ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *)
            &local_4c48.field_1);
    if ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE) {
      sVar25 = (this->primsMB).size_alloced;
      pPVar6 = (this->primsMB).items;
      if (pPVar6 != (PrimRefMB *)0x0) {
        pEVar23 = (EVP_PKEY_CTX *)(sVar25 * 0x50);
        if (pEVar23 < (EVP_PKEY_CTX *)0x1c00000) {
          alignedFree(pPVar6);
        }
        else {
          os_free(pPVar6,(size_t)pEVar23,(this->primsMB).alloc.hugepages);
        }
      }
      if (sVar25 != 0) {
        pMVar7 = (this->primsMB).alloc.device;
        pEVar23 = (EVP_PKEY_CTX *)(sVar25 * -0x50);
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,pEVar23,1);
      }
      *psVar1 = 0;
      (this->primsMB).size_alloced = 0;
      (this->primsMB).items = (PrimRefMB *)0x0;
    }
    BVHN<4>::cleanup(this->bvh,pEVar23);
  }
  BVHN<4>::postBuild(this->bvh,local_4cb0);
  return;
}

Assistant:

void build() 
      {
        /* initialize all half edge structures */
        size_t numPatches = scene->getNumPrimitives(SubdivMesh::geom_type,true);

        /* skip build for empty scene */
        if (numPatches == 0) {
          primsMB.resize(0);
          bounds.resize(0);
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }

        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "SubdivPatch1MBlurBuilderSAH");

        ParallelForForPrefixSumState<PrimInfoMB> pstate;

        /* calculate number of primitives (some patches need initial subdivision) */
        size_t numSubPatches, numSubPatchesMB;
        countSubPatches(numSubPatches, numSubPatchesMB, pstate);
        primsMB.resize(numSubPatches);
        bounds.resize(numSubPatchesMB);
        
        /* exit if there are no primitives to process */
        if (numSubPatches == 0) {
          bvh->set(BVH::emptyNode,empty,0);
          bvh->postBuild(t0);
          return;
        }
        
        /* Allocate memory for gregory and b-spline patches */
        bvh->subdiv_patches.resize(sizeof(SubdivPatch1) * numSubPatchesMB);

        /* rebuild BVH */
        rebuild(numSubPatches, pstate);
        
	/* clear temporary data for static geometry */
	if (scene->isStaticAccel()) {
          primsMB.clear();
        }
        bvh->cleanup();
        bvh->postBuild(t0);        
      }